

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

ScopedStmtBlock * __thiscall
kratos::SwitchStmt::add_switch_case
          (SwitchStmt *this,Const *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  ScopedStmtBlock *pSVar1;
  undefined1 local_30 [8];
  shared_ptr<kratos::Const> c;
  
  Var::as<kratos::Const>((Var *)local_30);
  pSVar1 = add_switch_case(this,(shared_ptr<kratos::Const> *)local_30,stmt);
  if (c.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               c.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pSVar1;
}

Assistant:

ScopedStmtBlock &SwitchStmt::add_switch_case(Const &switch_case,
                                             const std::shared_ptr<Stmt> &stmt) {
    auto c = switch_case.as<Const>();
    return add_switch_case(c, stmt);
}